

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void * __thiscall ObjectBlockPool<16,_4096>::Alloc(ObjectBlockPool<16,_4096> *this)

{
  FastVector<LargeBlock<16,_4096>_*,_false,_false> *this_00;
  uint uVar1;
  LargeBlock<16,_4096> **ppLVar2;
  LargeBlock<16,_4096> *pLVar3;
  MyLargeBlock *__s;
  MySmallBlock *pMVar4;
  ulong uVar5;
  uint uVar6;
  MyLargeBlock *tmp;
  MyLargeBlock *newPage;
  MyLargeBlock *local_20;
  
  pMVar4 = this->freeBlocks;
  if (pMVar4 == &this->lastBlock || pMVar4 == (MySmallBlock *)0x0) {
    if (this->lastNum == 0x1000) {
      __s = (MyLargeBlock *)NULLC::alignedAlloc(0x10010);
      local_20 = __s;
      memset(__s,0,0x10010);
      __s->next = this->activePages;
      this->activePages = __s;
      this->lastNum = 0;
      this_00 = &this->sortedPages;
      uVar1 = (this->sortedPages).count;
      if (uVar1 == (this->sortedPages).max) {
        FastVector<LargeBlock<16,_4096>_*,_false,_false>::grow_and_add(this_00,uVar1,&local_20);
      }
      else {
        (this->sortedPages).count = uVar1 + 1;
        (this->sortedPages).data[uVar1] = __s;
      }
      uVar1 = (this->sortedPages).count;
      if (0 < (int)(uVar1 - 1)) {
        uVar5 = (ulong)uVar1 - 2;
        uVar6 = uVar1;
        do {
          uVar6 = uVar6 - 1;
          if ((uVar1 <= uVar6) || (uVar1 <= uVar5)) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x7f,
                          "T &FastVector<LargeBlock<16, 4096> *>::operator[](unsigned int) [T = LargeBlock<16, 4096> *, zeroNewMemory = false, skipConstructor = false]"
                         );
          }
          ppLVar2 = this_00->data;
          pLVar3 = ppLVar2[uVar6];
          if (ppLVar2[uVar5] <= pLVar3) break;
          ppLVar2[uVar6] = ppLVar2[uVar5];
          this_00->data[uVar5] = pLVar3;
          uVar5 = uVar5 - 1;
        } while (1 < (int)uVar6);
      }
    }
    uVar1 = this->lastNum;
    this->lastNum = uVar1 + 1;
    pMVar4 = this->activePages->page + uVar1;
  }
  else {
    this->freeBlocks =
         (MySmallBlock *)(((ulong)(NULLC::OBJECT_MASK - 1) | 0xfffffffffffffffc) & pMVar4->marker);
  }
  return pMVar4;
}

Assistant:

void* Alloc()
	{
		MySmallBlock*	result;
		if(freeBlocks && freeBlocks != &lastBlock)
		{
			result = freeBlocks;
			freeBlocks = (MySmallBlock*)((intptr_t)freeBlocks->next & ~NULLC::OBJECT_MASK);
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock* newPage = new(NULLC::alignedAlloc(sizeof(MyLargeBlock))) MyLargeBlock;
				memset(newPage, 0, sizeof(MyLargeBlock));
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
				sortedPages.push_back(newPage);
				int index = sortedPages.size() - 1;
				while(index > 0 && sortedPages[index] < sortedPages[index - 1])
				{
					MyLargeBlock *tmp = sortedPages[index];
					sortedPages[index] = sortedPages[index - 1];
					sortedPages[index - 1] = tmp;
					index--;
				}
			}
			result = &activePages->page[lastNum++];
		}
		return result;
	}